

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QString * __thiscall
QStringBuilder<QString_&,_QLatin1StringView>::convertTo<QString>
          (QString *__return_storage_ptr__,QStringBuilder<QString_&,_QLatin1StringView> *this)

{
  long lVar1;
  long lVar2;
  char16_t *__dest;
  QChar *out;
  char16_t *__src;
  QLatin1StringView in;
  
  out = (QChar *)((ulong)(this->b).m_data | (ulong)(this->a->d).ptr);
  if (out == (QChar *)0x0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    lVar1 = (this->b).m_size;
    lVar2 = (this->a->d).size;
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QString::QString(__return_storage_ptr__,lVar1 + lVar2,Uninitialized);
    __dest = (__return_storage_ptr__->d).ptr;
    lVar1 = (this->a->d).size;
    if (lVar1 != 0) {
      __src = (this->a->d).ptr;
      if (__src == (char16_t *)0x0) {
        __src = L"";
      }
      memcpy(__dest,__src,lVar1 * 2);
    }
    in.m_size = (qsizetype)(__dest + lVar1);
    in.m_data = (char *)(this->b).m_size;
    QAbstractConcatenable::appendLatin1To((QAbstractConcatenable *)(this->b).m_data,in,out);
  }
  return __return_storage_ptr__;
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }